

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

string * __thiscall
TrodesConfig::getPrintStr_abi_cxx11_(string *__return_storage_ptr__,TrodesConfig *this,int indent)

{
  ostream *poVar1;
  reference this_00;
  reference this_01;
  int iVar2;
  int iVar3;
  int i;
  size_type sVar4;
  bool bVar5;
  string indentStr;
  string local_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::__cxx11::string::string((string *)&indentStr,"\t",(allocator *)&local_1c8);
  iVar2 = 0;
  if (0 < indent) {
    iVar2 = indent;
  }
  iVar3 = iVar2;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    std::operator<<((ostream *)&oss,(string *)&indentStr);
  }
  std::operator<<((ostream *)&oss,"Printing \'TrodesConfig\'\n");
  iVar3 = iVar2;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    std::operator<<((ostream *)&oss,(string *)&indentStr);
  }
  poVar1 = std::operator<<((ostream *)&oss,"    -devices vector size[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]:\n");
  sVar4 = 0;
  while( true ) {
    iVar3 = iVar2;
    if ((long)(int)(((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x48) <= (long)sVar4) break;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      std::operator<<((ostream *)&oss,(string *)&indentStr);
    }
    poVar1 = std::operator<<((ostream *)&oss,"        - i[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)sVar4);
    poVar1 = std::operator<<(poVar1,"] : \n");
    this_00 = std::vector<NDevice,_std::allocator<NDevice>_>::at(&this->devices,sVar4);
    NDevice::getPrintStr_abi_cxx11_(&local_1c8,this_00,indent + 2);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    sVar4 = sVar4 + 1;
  }
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    std::operator<<((ostream *)&oss,(string *)&indentStr);
  }
  poVar1 = std::operator<<((ostream *)&oss,"    -nTrodes vector size[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]:\n");
  sVar4 = 0;
  while( true ) {
    iVar3 = iVar2;
    if ((long)(int)(((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x48) <= (long)sVar4) break;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      std::operator<<((ostream *)&oss,(string *)&indentStr);
    }
    poVar1 = std::operator<<((ostream *)&oss,"        - i[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)sVar4);
    poVar1 = std::operator<<(poVar1,"] : \n");
    this_01 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::at(&this->nTrodes,sVar4);
    NTrodeObj::getPrintStr_abi_cxx11_(&local_1c8,this_01,indent + 2);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    sVar4 = sVar4 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&indentStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string TrodesConfig::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "\t";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'TrodesConfig'\n";

    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -devices vector size[" << devices.size() << "]:\n";

    for (int i = 0; i < (int)devices.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << devices.at(i).getPrintStr(indent+2) << "\n";
    }

    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -nTrodes vector size[" << nTrodes.size() << "]:\n";

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << nTrodes.at(i).getPrintStr(indent+2) << "\n";
    }
    return(oss.str());
}